

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  char cVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  void *pvVar5;
  Mio_Library_t *pLib;
  If_Man_t *pIfMan_00;
  If_DsdMan_t *pIVar6;
  Abc_Ntk_t *pAVar7;
  float fVar8;
  If_DsdMan_t *p;
  int c_1;
  int c;
  If_Man_t *pIfMan;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtkNew;
  If_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x70,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
  }
  pfVar4 = Abc_NtkGetCiArrivalFloats(pNtk);
  pPars->pTimesArr = pfVar4;
  pfVar4 = Abc_NtkGetCoRequiredFloats(pNtk);
  pPars->pTimesReq = pfVar4;
  if (((((pPars->fDelayOpt != 0) || (pPars->fDsdBalance != 0)) || (pPars->fUserRecLib != 0)) ||
      (pPars->fUserSesLib != 0)) && (pNtk->pManTime != (Abc_ManTime_t *)0x0)) {
    if ((pNtk->AndGateDelay == 0.0) && (!NAN(pNtk->AndGateDelay))) {
      pvVar5 = Abc_FrameReadLibGen();
      if (pvVar5 != (void *)0x0) {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        fVar8 = Mio_LibraryReadDelayAigNode(pLib);
        pNtk->AndGateDelay = fVar8;
      }
      if ((pNtk->AndGateDelay == 0.0) && (!NAN(pNtk->AndGateDelay))) {
        pNtk->AndGateDelay = 1.0;
        printf("The AIG-node delay is not set. Assuming unit-delay.\n");
      }
    }
    for (p._4_4_ = 0; iVar2 = Abc_NtkCiNum(pNtk), p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
      pPars->pTimesArr[p._4_4_] = pPars->pTimesArr[p._4_4_] / pNtk->AndGateDelay;
    }
    for (p._4_4_ = 0; iVar2 = Abc_NtkCoNum(pNtk), p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
      pPars->pTimesReq[p._4_4_] = pPars->pTimesReq[p._4_4_] / pNtk->AndGateDelay;
    }
  }
  if ((pPars->fLatchPaths != 0) && (pPars->pTimesArr != (float *)0x0)) {
    for (p._0_4_ = 0; iVar2 = Abc_NtkPiNum(pNtk), (int)p < iVar2; p._0_4_ = (int)p + 1) {
      pPars->pTimesArr[(int)p] = -1e+09;
    }
  }
  pIfMan_00 = Abc_NtkToIf(pNtk,pPars);
  if (pIfMan_00 == (If_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pPars->fPower != 0) {
      If_ManComputeSwitching(pIfMan_00);
    }
    if (pPars->fUseDsd != 0) {
      pIVar6 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      iVar2 = pPars->nLutSize;
      iVar3 = If_DsdManVarNum(pIVar6);
      if (iVar3 < iVar2) {
        __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                      ,0x9d,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
      }
      if (((pPars->pLutStruct != (char *)0x0) || (iVar2 = If_DsdManLutSize(pIVar6), iVar2 != 0)) &&
         ((pPars->pLutStruct == (char *)0x0 ||
          (cVar1 = *pPars->pLutStruct, iVar2 = If_DsdManLutSize(pIVar6), cVar1 + -0x30 != iVar2))))
      {
        __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                      ,0x9e,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
      }
      pIVar6 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      pIfMan_00->pIfDsdMan = pIVar6;
      if (pPars->fDsdBalance != 0) {
        If_DsdManAllocIsops(pIfMan_00->pIfDsdMan,pPars->nLutSize);
      }
    }
    iVar2 = If_ManPerformMapping(pIfMan_00);
    if (iVar2 == 0) {
      If_ManStop(pIfMan_00);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pTemp = Abc_NtkFromIf(pIfMan_00,pNtk);
      if (pTemp == (Abc_Ntk_t *)0x0) {
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else {
        If_ManStop(pIfMan_00);
        if (((pPars->fDelayOpt == 0) && (pPars->fDsdBalance == 0)) && (pPars->fUserRecLib == 0)) {
          if ((pPars->fBidec != 0) && (pPars->nLutSize < 9)) {
            Abc_NtkBidecResyn(pTemp,0);
          }
        }
        else {
          pAVar7 = Abc_NtkStrash(pTemp,0,0,0);
          Abc_NtkDelete(pTemp);
          pTemp = pAVar7;
        }
        if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
          pAVar7 = Abc_NtkDup(pNtk->pExdc);
          pTemp->pExdc = pAVar7;
        }
        iVar2 = Abc_NtkCheck(pTemp);
        if (iVar2 == 0) {
          printf("Abc_NtkIf: The network check has failed.\n");
          Abc_NtkDelete(pTemp);
          pNtk_local = (Abc_Ntk_t *)0x0;
        }
        else {
          pNtk_local = pTemp;
        }
      }
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    If_Man_t * pIfMan;

    assert( Abc_NtkIsStrash(pNtk) );

    // get timing information
    pPars->pTimesArr = Abc_NtkGetCiArrivalFloats(pNtk);
    pPars->pTimesReq = Abc_NtkGetCoRequiredFloats(pNtk);

    // update timing info to reflect logic level
    if ( (pPars->fDelayOpt || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib) && pNtk->pManTime )
    {
        int c;
        if ( pNtk->AndGateDelay == 0.0 )
        {
            if ( Abc_FrameReadLibGen() )
                pNtk->AndGateDelay = Mio_LibraryReadDelayAigNode((Mio_Library_t *)Abc_FrameReadLibGen());
            if ( pNtk->AndGateDelay == 0.0 )
            {
                pNtk->AndGateDelay = 1.0;
                printf( "The AIG-node delay is not set. Assuming unit-delay.\n" );
            }
        }
        for ( c = 0; c < Abc_NtkCiNum(pNtk); c++ )
            pPars->pTimesArr[c] /= pNtk->AndGateDelay;
        for ( c = 0; c < Abc_NtkCoNum(pNtk); c++ )
            pPars->pTimesReq[c] /= pNtk->AndGateDelay;
    }

    // set the latch paths
    if ( pPars->fLatchPaths && pPars->pTimesArr )
    {
        int c;
        for ( c = 0; c < Abc_NtkPiNum(pNtk); c++ )
            pPars->pTimesArr[c] = -ABC_INFINITY;
    }

    // create FPGA mapper
    pIfMan = Abc_NtkToIf( pNtk, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    if ( pPars->fPower )
        If_ManComputeSwitching( pIfMan );

    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }

    // perform FPGA mapping
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }

    // transform the result of mapping into the new network
    pNtkNew = Abc_NtkFromIf( pIfMan, pNtk );
    if ( pNtkNew == NULL )
        return NULL;
    If_ManStop( pIfMan );
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fUserRecLib )
    {
        pNtkNew = Abc_NtkStrash( pTemp = pNtkNew, 0, 0, 0 );
        Abc_NtkDelete( pTemp );
    }
    else if ( pPars->fBidec && pPars->nLutSize <= 8 )
        Abc_NtkBidecResyn( pNtkNew, 0 );

    // duplicate EXDC
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkIf: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}